

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialAttributeDecoder::DecodePortableAttribute
          (SequentialAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  uint8_t uVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 in_RDX;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_RSI;
  long *in_RDI;
  size_t unaff_retaddr;
  PointAttribute *in_stack_00000008;
  
  uVar1 = GeometryAttribute::num_components((GeometryAttribute *)in_RDI[2]);
  if (uVar1 != '\0') {
    std::
    vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
    ::size(in_RSI);
    bVar2 = PointAttribute::Reset(in_stack_00000008,unaff_retaddr);
    if (bVar2) {
      uVar3 = (**(code **)(*in_RDI + 0x40))(in_RDI,in_RSI,in_RDX);
      if ((uVar3 & 1) == 0) {
        return false;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool SequentialAttributeDecoder::DecodePortableAttribute(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  if (attribute_->num_components() <= 0 ||
      !attribute_->Reset(point_ids.size())) {
    return false;
  }
  if (!DecodeValues(point_ids, in_buffer)) {
    return false;
  }
  return true;
}